

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url_encode.cpp
# Opt level: O3

string_t __thiscall
duckdb::URLDecodeOperator::Operation<duckdb::string_t,duckdb::string_t>
          (URLDecodeOperator *this,string_t input,Vector *result)

{
  undefined8 uVar1;
  ulong uVar2;
  char *pcVar3;
  char *pcVar4;
  string_t result_str;
  undefined1 local_38 [16];
  undefined8 local_28;
  char *local_20;
  
  local_20 = input.value._0_8_;
  pcVar4 = (char *)((long)&local_28 + 4);
  if (0xc < (uint)this) {
    pcVar4 = local_20;
  }
  local_28 = this;
  uVar2 = duckdb::StringUtil::URLDecodeSize(pcVar4,(ulong)this & 0xffffffff,false);
  local_38 = duckdb::StringVector::EmptyString(input.value._8_8_,uVar2);
  pcVar3 = local_38._8_8_;
  if (local_38._0_4_ < 0xd) {
    pcVar3 = local_38 + 4;
  }
  duckdb::StringUtil::URLDecodeBuffer(pcVar4,(ulong)this & 0xffffffff,pcVar3,false);
  uVar1 = local_38._0_8_;
  uVar2 = uVar1 & 0xffffffff;
  if (uVar2 < 0xd) {
    memset(local_38 + 4 + uVar2,0,0xc - uVar2);
  }
  else {
    local_38._4_4_ = *(undefined4 *)local_38._8_8_;
  }
  return (anon_union_16_2_67f50693_for_value)(anon_union_16_2_67f50693_for_value)local_38;
}

Assistant:

static RESULT_TYPE Operation(INPUT_TYPE input, Vector &result) {
		auto input_str = input.GetData();
		auto input_size = input.GetSize();
		idx_t result_length = StringUtil::URLDecodeSize(input_str, input_size);
		auto result_str = StringVector::EmptyString(result, result_length);
		StringUtil::URLDecodeBuffer(input_str, input_size, result_str.GetDataWriteable());
		result_str.Finalize();
		return result_str;
	}